

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=(Option<Catch::GroupInfo> *this,GroupInfo *_value)

{
  Option<Catch::GroupInfo> *in_RDI;
  GroupInfo *in_stack_ffffffffffffffd8;
  Option<Catch::GroupInfo> *in_stack_ffffffffffffffe0;
  GroupInfo *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  this_00 = (GroupInfo *)in_RDI->storage;
  GroupInfo::GroupInfo(this_00,in_stack_ffffffffffffffd8);
  in_RDI->nullableValue = this_00;
  return in_RDI;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }